

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::Attribute::set_value<tinyusdz::value::ValueBlock>(Attribute *this,ValueBlock *v)

{
  string local_40 [32];
  
  if ((this->_type_name)._M_string_length == 0) {
    tinyusdz::value::TypeTraits<tinyusdz::value::ValueBlock>::type_name_abi_cxx11_();
    ::std::__cxx11::string::operator=((string *)&this->_type_name,local_40);
    ::std::__cxx11::string::_M_dispose();
  }
  linb::any::operator=((any *)&this->_var,v);
  return;
}

Assistant:

void set_value(const T &v) {
    if (_type_name.empty()) {
      _type_name = value::TypeTraits<T>::type_name();
    }
    _var.set_value(v);
  }